

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_scalar_split(secp256k1_scalar *full)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  uint uVar11;
  uchar *p2;
  secp256k1_scalar *psVar12;
  secp256k1_ge *ge;
  secp256k1_scalar *psVar13;
  secp256k1_scalar *psVar14;
  secp256k1_context *ctx;
  secp256k1_context *psVar15;
  byte bVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  undefined8 uStack_2a0;
  secp256k1_ge *psStack_298;
  size_t sStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  size_t sStack_270;
  int iStack_264;
  undefined1 auStack_260 [104];
  ulong uStack_1f8;
  undefined1 auStack_1f0 [105];
  uint64_t uStack_187;
  uint64_t uStack_17f;
  uint64_t uStack_177;
  secp256k1_ge sStack_160;
  secp256k1_scalar *psStack_f8;
  secp256k1_scalar *psStack_f0;
  secp256k1_scalar local_c8;
  char local_a8 [40];
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  secp256k1_scalar local_40;
  
  psVar13 = &local_c8;
  psVar14 = &local_c8;
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  secp256k1_scalar_split_lambda(&local_60,&local_80,full);
  secp256k1_scalar_mul(&local_40,&secp256k1_const_lambda,&local_80);
  psVar12 = &local_40;
  secp256k1_scalar_add(&local_40,&local_40,&local_60);
  iVar9 = (int)psVar12;
  secp256k1_scalar_verify(&local_40);
  psVar12 = full;
  secp256k1_scalar_verify(full);
  if ((((local_40.d[0] == full->d[0]) && (local_40.d[1] == full->d[1])) &&
      (local_40.d[2] == full->d[2])) && (local_40.d[3] == full->d[3])) {
    iVar9 = secp256k1_scalar_is_high(&local_60);
    if (iVar9 != 0) {
      secp256k1_scalar_negate(&local_60,&local_60);
    }
    iVar9 = secp256k1_scalar_is_high(&local_80);
    if (iVar9 != 0) {
      secp256k1_scalar_negate(&local_80,&local_80);
    }
    psVar12 = &local_60;
    secp256k1_scalar_get_b32((uchar *)&local_c8,psVar12);
    iVar9 = (int)psVar12;
    lVar10 = 0;
    do {
      psVar12 = psVar13;
      if (local_a8[lVar10] != *(char *)((long)local_c8.d + lVar10)) goto LAB_00157a9a;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    psVar12 = &local_80;
    secp256k1_scalar_get_b32((uchar *)&local_c8,psVar12);
    iVar9 = (int)psVar12;
    lVar10 = 0;
    while (local_a8[lVar10] == *(char *)((long)local_c8.d + lVar10)) {
      lVar10 = lVar10 + 1;
      if (lVar10 == 0x10) {
        return;
      }
    }
  }
  else {
    test_scalar_split_cold_3();
LAB_00157a9a:
    psVar14 = psVar12;
    test_scalar_split_cold_1();
  }
  test_scalar_split_cold_2();
  psStack_f0 = &local_40;
  psStack_f8 = full;
  auStack_260._80_8_ = 3;
  iStack_264 = iVar9;
  auStack_260._88_4_ = extraout_EDX;
  auStack_260._96_8_ = psVar14;
  do {
    bVar18 = iStack_264 != 0;
    uStack_17f = psVar14[1].d[2];
    uStack_177 = psVar14[1].d[3];
    auStack_1f0._97_8_ = psVar14[1].d[0];
    uStack_187 = psVar14[1].d[1];
    auStack_1f0._81_8_ = psVar14->d[2];
    auStack_1f0._89_8_ = psVar14->d[3];
    auStack_1f0._65_8_ = psVar14->d[0];
    auStack_1f0._73_8_ = psVar14->d[1];
    auStack_260._8_8_ = auStack_1f0 + auStack_260._80_8_ + 0x40;
    lVar10 = auStack_260._80_8_ - 0x41;
    auStack_260._16_8_ = -lVar10;
    auStack_260._24_8_ = 0;
    auStack_260._32_8_ = 0;
    auStack_260._40_4_ = 0;
    auStack_260._44_4_ = 0;
    bVar19 = auStack_260._80_8_ == 0x21;
    auStack_260._92_4_ = (uint)(lVar10 == 0) * 4;
    uStack_1f8 = (ulong)(lVar10 == 0 || bVar19);
    uVar11 = 0;
    do {
      auStack_1f0[0x40] = (char)uVar11;
      uVar17 = *(byte *)((long)psVar14[1].d + 0x1f) & 1 | 2;
      if ((iStack_264 == 0 || auStack_260._88_4_ == 0) || (uVar11 & 4) != auStack_260._92_4_) {
        bVar16 = 0;
      }
      else {
        bVar16 = ((uVar11 & 0xfb) == uVar17 || uVar11 == 4) & (byte)uStack_1f8;
      }
      psVar15 = CTX;
      if ((((bVar18 && bVar19) && (uVar11 & 0xfe) == 2) | bVar16) != 1) {
        auStack_1f0._48_8_ = 0xfefefefefefefefe;
        auStack_1f0._56_8_ = 0xfefefefefefefefe;
        auStack_1f0._32_8_ = 0xfefefefefefefefe;
        auStack_1f0._40_4_ = -0x1010102;
        auStack_1f0._44_4_ = -0x1010102;
        auStack_1f0._16_8_ = 0xfefefefefefefefe;
        auStack_1f0._24_8_ = 0xfefefefefefefefe;
        auStack_1f0._0_8_ = 0xfefefefefefefefe;
        auStack_1f0._8_8_ = 0xfefefefefefefefe;
        auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
        auStack_260._16_8_ = 0x40;
        auStack_260._24_8_ = 0;
        auStack_260._32_8_ = 0;
        auStack_260._40_4_ = 0;
        auStack_260._44_4_ = 0;
        uStack_2a0 = 0;
        ge = (secp256k1_ge *)auStack_1f0;
        auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
        iVar9 = secp256k1_ec_pubkey_parse
                          (CTX,(secp256k1_pubkey *)auStack_1f0,auStack_1f0 + 0x40,auStack_260._80_8_
                          );
        ctx = CTX;
        if (iVar9 != 0) {
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_001581ab;
        }
        auStack_260._16_8_ = 0x40;
        auStack_260._24_8_ = 0;
        auStack_260._32_8_ = 0;
        auStack_260._40_4_ = 0;
        auStack_260._44_4_ = 0;
        uStack_2a0 = 0;
        auStack_260._0_8_ = (CTX->illegal_callback).fn;
        auStack_260._8_8_ = (CTX->illegal_callback).data;
        if (CTX == &secp256k1_context_static_) goto LAB_001581b0;
        (CTX->illegal_callback).fn = counting_callback_fn;
        (ctx->illegal_callback).data = &uStack_2a0;
        ge = &sStack_160;
        iVar9 = secp256k1_pubkey_load(ctx,ge,(secp256k1_pubkey *)auStack_1f0);
        psVar15 = CTX;
        if (iVar9 != 0) goto LAB_001581bf;
        (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_260._0_8_;
        (psVar15->illegal_callback).data = (void *)auStack_260._8_8_;
        if ((int)uStack_2a0 == 1) goto LAB_00158179;
LAB_001581c4:
        ec_pubkey_parse_pointtest_cold_3();
LAB_001581c9:
        ec_pubkey_parse_pointtest_cold_13();
LAB_001581ce:
        ec_pubkey_parse_pointtest_cold_7();
LAB_001581d3:
        ec_pubkey_parse_pointtest_cold_12();
LAB_001581d8:
        ec_pubkey_parse_pointtest_cold_11();
LAB_001581dd:
        ec_pubkey_parse_pointtest_cold_8();
LAB_001581e2:
        ec_pubkey_parse_pointtest_cold_9();
LAB_001581e7:
        ec_pubkey_parse_pointtest_cold_6();
LAB_001581ec:
        ec_pubkey_parse_pointtest_cold_10();
        *(undefined1 *)&(ctx->ecmult_gen_ctx).built = 4;
        uVar3 = (ge->x).n[1];
        uVar4 = (ge->x).n[2];
        uVar5 = (ge->x).n[3];
        *(uint64_t *)((long)&(ctx->ecmult_gen_ctx).built + 1) = (ge->x).n[0];
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 1) = uVar3;
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 9) = uVar4;
        *(uint64_t *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 0x11) = uVar5;
        uVar6 = extraout_RDX[1];
        uVar7 = extraout_RDX[2];
        uVar8 = extraout_RDX[3];
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).scalar_offset.d + 0x19) = *extraout_RDX;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 1) = uVar6;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 9) = uVar7;
        *(undefined8 *)((long)(ctx->ecmult_gen_ctx).ge_offset.x.n + 0x11) = uVar8;
        return;
      }
      auStack_1f0._0_8_ = 0;
      auStack_1f0._8_8_ = 0;
      auStack_1f0._16_8_ = 0;
      auStack_1f0._24_8_ = 0;
      auStack_1f0._32_8_ = 0;
      auStack_1f0._40_4_ = 0;
      auStack_1f0._44_4_ = 0;
      auStack_1f0._48_8_ = 0;
      auStack_1f0._56_8_ = 0;
      auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
      auStack_260._16_8_ = 0x40;
      auStack_260._24_8_ = 0;
      auStack_260._32_8_ = 0;
      auStack_260._40_4_ = 0;
      auStack_260._44_4_ = 0;
      uStack_2a0 = 0;
      ge = (secp256k1_ge *)auStack_1f0;
      auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
      iVar9 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)auStack_1f0,auStack_1f0 + 0x40,auStack_260._80_8_);
      if (iVar9 == 0) {
LAB_001581ab:
        ec_pubkey_parse_pointtest_cold_15();
        ctx = psVar15;
LAB_001581b0:
        ec_pubkey_parse_pointtest_cold_4();
LAB_001581b5:
        ec_pubkey_parse_pointtest_cold_14();
LAB_001581ba:
        ec_pubkey_parse_pointtest_cold_5();
LAB_001581bf:
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_001581c4;
      }
      auStack_260._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430005;
      auStack_260._16_8_ = 0x40;
      auStack_260._24_8_ = 0;
      auStack_260._32_8_ = 0;
      auStack_260._40_4_ = 0;
      auStack_260._44_4_ = 0;
      sStack_270 = 0x41;
      uStack_2a0 = 0x4d430001;
      sStack_290 = 0x41;
      uStack_288 = 0;
      uStack_280 = 0;
      uStack_278 = 0;
      ge = (secp256k1_ge *)auStack_260;
      ctx = CTX;
      psStack_298 = (secp256k1_ge *)auStack_260;
      auStack_260._8_8_ = (secp256k1_ge *)auStack_1f0;
      iVar9 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)auStack_260,&sStack_270,(secp256k1_pubkey *)auStack_1f0,0x102)
      ;
      psVar14 = (secp256k1_scalar *)auStack_260._96_8_;
      if (iVar9 == 0) goto LAB_001581b5;
      uStack_2a0 = 0x4d430005;
      sStack_290 = sStack_270;
      uStack_288 = 0;
      uStack_280 = 0;
      uStack_278 = 0;
      uVar1 = (ulong)((long)ctx << 3) >> 0x33;
      uVar2 = (((long)ctx << 3 | (ulong)ctx >> 0x3d) << 0xd | uVar1) >> 3;
      ctx = (secp256k1_context *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
      psStack_298 = (secp256k1_ge *)auStack_260;
      if (sStack_270 != 0x21) goto LAB_001581ba;
      lVar10 = 1;
      do {
        if (auStack_260[lVar10] != auStack_1f0[lVar10 + 0x40]) goto LAB_001581e7;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x21);
      if ((auStack_260._80_8_ == 0x21) && (auStack_260[0] != auStack_1f0[0x40])) goto LAB_001581c9;
      if (bVar16 != 0) {
        if (auStack_260[0] != (char)uVar17) goto LAB_001581ce;
        ge = &sStack_160;
        ctx = CTX;
        iVar9 = secp256k1_pubkey_load(CTX,&sStack_160,(secp256k1_pubkey *)auStack_1f0);
        if (iVar9 == 0) goto LAB_001581d3;
        auStack_1f0._48_8_ = 0;
        auStack_1f0._56_8_ = 0;
        auStack_1f0._32_8_ = 0;
        auStack_1f0._40_4_ = 0;
        auStack_1f0._44_4_ = 0;
        auStack_1f0._16_8_ = 0;
        auStack_1f0._24_8_ = 0;
        auStack_1f0._0_8_ = 0;
        auStack_1f0._8_8_ = 0;
        uStack_2a0 = 0x4d430001;
        sStack_290 = 0x40;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        psStack_298 = (secp256k1_ge *)auStack_1f0;
        secp256k1_ge_to_bytes((uchar *)auStack_1f0,&sStack_160);
        sStack_270 = 0x41;
        uStack_2a0 = 0x4d430001;
        sStack_290 = 0x41;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        ge = (secp256k1_ge *)auStack_260;
        ctx = CTX;
        psStack_298 = (secp256k1_ge *)auStack_260;
        iVar9 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)auStack_260,&sStack_270,(secp256k1_pubkey *)auStack_1f0,2);
        if (iVar9 == 0) goto LAB_001581d8;
        uStack_2a0 = 0x4d430005;
        sStack_290 = sStack_270;
        uStack_288 = 0;
        uStack_280 = 0;
        uStack_278 = 0;
        uVar1 = (ulong)((long)ctx << 3) >> 0x33;
        uVar2 = (((long)ctx << 3 | (ulong)ctx >> 0x3d) << 0xd | uVar1) >> 3;
        ctx = (secp256k1_context *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
        psStack_298 = (secp256k1_ge *)auStack_260;
        if (sStack_270 == 0x41) {
          if (auStack_260[0] != '\x04') goto LAB_001581e2;
          lVar10 = 0;
          do {
            if (auStack_260[lVar10 + 1] != *(char *)((long)psVar14->d + lVar10)) goto LAB_001581ec;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x40);
          goto LAB_00158179;
        }
        goto LAB_001581dd;
      }
LAB_00158179:
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x100);
    auStack_260._80_8_ = auStack_260._80_8_ + 1;
    if (auStack_260._80_8_ == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}